

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

uint __thiscall capnp::Type::hashCode(Type *this)

{
  byte bVar1;
  Which WVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ArrayPtr<const_unsigned_char> s;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  WVar2 = this->baseType;
  uVar3 = (uint)WVar2;
  if (WVar2 < LIST) {
    bVar1 = this->listDepth;
    if (bVar1 == 0) {
      uVar3 = uVar3 * 0x8000 + ~uVar3;
      uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
      uVar3 = (uVar3 >> 4 ^ uVar3) * 0x809;
      return uVar3 >> 0x10 ^ uVar3;
    }
    uVar3 = uVar3 * 0x8000 + ~uVar3;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    uVar3 = (uVar3 >> 4 ^ uVar3) * 0x809;
    local_28 = uVar3 >> 0x10 ^ uVar3;
    uVar3 = (uint)bVar1 * 0x8000 + ~(uint)bVar1;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    local_24 = (uVar3 >> 4 ^ uVar3) * 0x809;
    local_24 = local_24 >> 0x10 ^ local_24;
    sVar6 = 8;
  }
  else if (uVar3 - 0xf < 3) {
    if (this->listDepth == '\0') {
      uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(this->field_4).schema);
      return uVar4;
    }
    local_28 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(this->field_4).schema);
    uVar3 = (uint)this->listDepth * 0x8000 + ~(uint)this->listDepth;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    local_24 = (uVar3 >> 4 ^ uVar3) * 0x809;
    local_24 = local_24 >> 0x10 ^ local_24;
    sVar6 = 8;
  }
  else {
    if (WVar2 != ANY_POINTER) {
      kj::_::unreachable();
    }
    uVar5 = (this->field_4).scopeId;
    uVar3 = (uint)(this->field_3).paramIndex * 0x8000 + ~(uint)(this->field_3).paramIndex;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    uVar3 = (uVar3 >> 4 ^ uVar3) * 0x809;
    local_28 = uVar3 >> 0x10 ^ uVar3;
    local_24 = (uint)this->isImplicitParam;
    if (uVar5 >> 0x20 == 0) {
      uVar3 = (uint)uVar5 * 0x8000 + ~(uint)uVar5;
      uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
      local_20 = (uVar3 >> 4 ^ uVar3) * 0x809;
      local_20 = local_20 >> 0x10 ^ local_20;
    }
    else {
      uVar5 = uVar5 * 0x40000 + ~uVar5;
      uVar5 = (uVar5 >> 0x1f ^ uVar5) * 0x15;
      uVar5 = (uVar5 >> 0xb ^ uVar5) * 0x41;
      local_20 = (uint)(uVar5 >> 0x16) ^ (uint)uVar5;
    }
    uVar3 = (uint)this->listDepth * 0x8000 + ~(uint)this->listDepth;
    uVar3 = (uVar3 >> 0xc ^ uVar3) * 5;
    local_1c = (uVar3 >> 4 ^ uVar3) * 0x809;
    local_1c = local_1c >> 0x10 ^ local_1c;
    sVar6 = 0x10;
  }
  s.size_ = sVar6;
  s.ptr = (uchar *)&local_28;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  return uVar4;
}

Assistant:

uint Type::hashCode() const {
  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      if (listDepth == 0) {
        // Make sure that hashCode(Type(baseType)) == hashCode(baseType), otherwise HashMap lookups
        // keyed by `Type` won't work when the caller passes `baseType` as the key.
        return kj::hashCode(baseType);
      } else {
        return kj::hashCode(baseType, listDepth);
      }

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      if (listDepth == 0) {
        // Make sure that hashCode(Type(schema)) == hashCode(schema), otherwise HashMap lookups
        // keyed by `Type` won't work when the caller passes `schema` as the key.
        return kj::hashCode(schema);
      } else {
        return kj::hashCode(schema, listDepth);
      }

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER: {
      // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
      // both branches compile to the same instructions and can optimize it away.
      uint16_t val = scopeId != 0 || isImplicitParam ?
          paramIndex : static_cast<uint16_t>(anyPointerKind);
      return kj::hashCode(val, isImplicitParam, scopeId, listDepth);
    }
  }

  KJ_UNREACHABLE;
}